

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O1

void __thiscall
tchecker::
intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
::~intrusive_shared_ptr_t
          (intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
           *this)

{
  make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *pmVar1;
  pointer pcVar2;
  underflow_error *this_00;
  
  pmVar1 = this->_t;
  if (pmVar1 != (make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *)0x0) {
    pcVar2 = pmVar1[-1].super_transition_t.super_transition_t._tgt_invariant.
             super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pcVar2 == (pointer)0x0) {
      this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
      std::underflow_error::underflow_error(this_00,"reference counter underflow");
      __cxa_throw(this_00,&std::underflow_error::typeinfo,std::underflow_error::~underflow_error);
    }
    pmVar1[-1].super_transition_t.super_transition_t._tgt_invariant.
    super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)&pcVar2[-1]._value + 3);
  }
  this->_t = (make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *)0x0;
  return;
}

Assistant:

inline void reset(T * t = nullptr)
  {
    if (t != nullptr)
      t->take_reference();
    if (_t != nullptr)
      _t->release_reference();
    _t = t;
  }